

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

int __thiscall
cmGlobalGenerator::Build
          (cmGlobalGenerator *this,int jobs,string *param_2,string *bindir,string *projectName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,string *output,string *makeCommandCSTR,string *config,
          cmBuildOptions *buildOptions,bool verbose,cmDuration timeout,OutputOption outputflag,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nativeOptions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppGVar2;
  pointer pcVar3;
  cmake *this_00;
  bool bVar4;
  bool bVar5;
  char *__s;
  long lVar6;
  long *plVar7;
  pointer pGVar8;
  int iVar9;
  pointer *rng;
  string_view separator;
  string_view separator_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int retVal;
  string makeCommandStr;
  allocator_type local_121;
  string outputBuffer;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  cleanCommand;
  undefined1 local_d8 [32];
  string realConfig;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  makeCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  cmWorkingDirectory workdir;
  
  bVar5 = cmSystemTools::s_RunCommandHideConsole;
  cmWorkingDirectory::cmWorkingDirectory(&workdir,bindir);
  std::__cxx11::string::append((char *)output);
  std::__cxx11::string::_M_append((char *)output,(ulong)(bindir->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)output);
  if (workdir.ResultCode != 0) {
    cmSystemTools::s_RunCommandHideConsole = bVar5;
    __s = strerror(workdir.ResultCode);
    realConfig.field_2._M_allocated_capacity = strlen(__s);
    realConfig._M_dataplus._M_p = (pointer)0x1c;
    realConfig._M_string_length = (size_type)anon_var_dwarf_142f179;
    views._M_len = 2;
    views._M_array = (iterator)&realConfig;
    realConfig.field_2._8_8_ = __s;
    cmCatViews_abi_cxx11_(&outputBuffer,views);
    cmSystemTools::Error(&outputBuffer);
    std::__cxx11::string::_M_append((char *)output,(ulong)outputBuffer._M_dataplus._M_p);
    std::__cxx11::string::append((char *)output);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputBuffer._M_dataplus._M_p != &outputBuffer.field_2) {
      operator_delete(outputBuffer._M_dataplus._M_p,
                      CONCAT71(outputBuffer.field_2._M_allocated_capacity._1_7_,
                               outputBuffer.field_2._M_local_buf[0]) + 1);
    }
    iVar9 = 1;
    goto LAB_0039038a;
  }
  realConfig._M_dataplus._M_p = (pointer)&realConfig.field_2;
  pcVar3 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&realConfig,pcVar3,pcVar3 + config->_M_string_length);
  if (realConfig._M_string_length == 0) {
    (*this->_vptr_cmGlobalGenerator[0x25])(&outputBuffer);
    std::__cxx11::string::operator=((string *)&realConfig,(string *)&outputBuffer);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputBuffer._M_dataplus._M_p != &outputBuffer.field_2) {
      operator_delete(outputBuffer._M_dataplus._M_p,
                      CONCAT71(outputBuffer.field_2._M_allocated_capacity._1_7_,
                               outputBuffer.field_2._M_local_buf[0]) + 1);
    }
  }
  retVal = 0;
  cmSystemTools::s_RunCommandHideConsole = true;
  outputBuffer._M_dataplus._M_p = (pointer)&outputBuffer.field_2;
  outputBuffer._M_string_length = 0;
  outputBuffer.field_2._M_local_buf[0] = '\0';
  (*this->_vptr_cmGlobalGenerator[0x13])
            (&makeCommand,this,makeCommandCSTR,projectName,bindir,targets,&realConfig,
             (ulong)(uint)jobs,(ulong)verbose,buildOptions,nativeOptions);
  if (outputflag == OUTPUT_PASSTHROUGH) {
    outputflag = makeCommand.
                 super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].super_GeneratedMakeCommand.
                 RequiresOutputForward ^ OUTPUT_PASSTHROUGH;
  }
  makeCommandStr._M_dataplus._M_p = (pointer)&makeCommandStr.field_2;
  if (buildOptions->Clean == true) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&makeCommandStr,"clean","");
    __l._M_len = 1;
    __l._M_array = &makeCommandStr;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d8,__l,&local_121);
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (*this->_vptr_cmGlobalGenerator[0x13])
              (&cleanCommand,this,makeCommandCSTR,projectName,bindir,local_d8,&realConfig,
               (ulong)(uint)jobs,(ulong)verbose,buildOptions,&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d8);
    paVar1 = &makeCommandStr.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)makeCommandStr._M_dataplus._M_p != paVar1) {
      operator_delete(makeCommandStr._M_dataplus._M_p,
                      CONCAT71(makeCommandStr.field_2._M_allocated_capacity._1_7_,
                               makeCommandStr.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::append((char *)output);
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(&makeCommandStr,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_start,separator,(string_view)ZEXT816(0));
    std::__cxx11::string::_M_append((char *)output,(ulong)makeCommandStr._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)makeCommandStr._M_dataplus._M_p != paVar1) {
      operator_delete(makeCommandStr._M_dataplus._M_p,
                      CONCAT71(makeCommandStr.field_2._M_allocated_capacity._1_7_,
                               makeCommandStr.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::append((char *)output);
    if ((long)cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20) {
      bVar4 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)cleanCommand.
                            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start,&outputBuffer,&outputBuffer,
                         &retVal,(char *)0x0,outputflag,timeout,Auto);
      if (bVar4) {
        std::__cxx11::string::_M_append((char *)output,(ulong)outputBuffer._M_dataplus._M_p);
        std::
        vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
        ::~vector(&cleanCommand);
        goto LAB_0038ff41;
      }
      cmSystemTools::s_RunCommandHideConsole = bVar5;
      makeCommandStr._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&makeCommandStr,"Generator: execution of make clean failed.","");
      cmSystemTools::Error(&makeCommandStr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)makeCommandStr._M_dataplus._M_p != paVar1) {
        operator_delete(makeCommandStr._M_dataplus._M_p,
                        CONCAT71(makeCommandStr.field_2._M_allocated_capacity._1_7_,
                                 makeCommandStr.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::_M_append((char *)output,(ulong)outputBuffer._M_dataplus._M_p);
      std::__cxx11::string::append((char *)output);
    }
    else {
      this_00 = this->CMakeInstance;
      makeCommandStr._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&makeCommandStr,
                 "The generator did not produce exactly one command for the \'clean\' target","");
      local_d8._0_8_ = (element_type *)0x0;
      local_d8._8_8_ = (pointer)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_d8);
      cmake::IssueMessage(this_00,INTERNAL_ERROR,&makeCommandStr,(cmListFileBacktrace *)local_d8);
      if ((pointer)local_d8._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)makeCommandStr._M_dataplus._M_p != paVar1) {
        operator_delete(makeCommandStr._M_dataplus._M_p,
                        CONCAT71(makeCommandStr.field_2._M_allocated_capacity._1_7_,
                                 makeCommandStr.field_2._M_local_buf[0]) + 1);
      }
    }
    std::
    vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
    ::~vector(&cleanCommand);
    iVar9 = 1;
  }
  else {
LAB_0038ff41:
    makeCommandStr._M_dataplus._M_p = (pointer)&makeCommandStr.field_2;
    makeCommandStr._M_string_length = 0;
    makeCommandStr.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)output);
    retVal = 0;
    if (makeCommand.
        super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        makeCommand.
        super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      rng = (pointer *)
            makeCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        separator_00._M_str = " ";
        separator_00._M_len = 1;
        cmJoin((string *)&cleanCommand,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)rng,separator_00,(string_view)ZEXT816(0));
        std::__cxx11::string::operator=((string *)&makeCommandStr,(string *)&cleanCommand);
        if (cleanCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&cleanCommand.
                      super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(cleanCommand.
                          super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((cleanCommand.
                                           super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         super_GeneratedMakeCommand).PrimaryCommand.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if ((pointer)rng !=
            makeCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::append((char *)&makeCommandStr);
        }
        std::__cxx11::string::_M_append((char *)output,(ulong)makeCommandStr._M_dataplus._M_p);
        bVar4 = cmSystemTools::RunSingleCommand
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)rng,&outputBuffer,&outputBuffer,&retVal,(char *)0x0,outputflag,timeout
                           ,Auto);
        if (!bVar4) {
          cmSystemTools::s_RunCommandHideConsole = bVar5;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cleanCommand,"Generator: execution of make failed. Make command was: ",
                         &makeCommandStr);
          ppGVar2 = &cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          cmSystemTools::Error((string *)&cleanCommand);
          if (cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppGVar2) {
            operator_delete(cleanCommand.
                            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((cleanCommand.
                                             super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           super_GeneratedMakeCommand).PrimaryCommand.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          std::__cxx11::string::_M_append((char *)output,(ulong)outputBuffer._M_dataplus._M_p);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d8,"\nGenerator: execution of make failed. Make command was: ",
                         &makeCommandStr);
          plVar7 = (long *)std::__cxx11::string::append(local_d8);
          pGVar8 = (pointer)(plVar7 + 2);
          if ((pointer)*plVar7 == pGVar8) {
            cleanCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pGVar8->super_GeneratedMakeCommand).PrimaryCommand.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            cleanCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)ppGVar2;
          }
          else {
            cleanCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pGVar8->super_GeneratedMakeCommand).PrimaryCommand.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            cleanCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar7;
          }
          cleanCommand.
          super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar7[1];
          *plVar7 = (long)pGVar8;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)output,
                     (ulong)cleanCommand.
                            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          if (cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppGVar2) {
            operator_delete(cleanCommand.
                            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((cleanCommand.
                                             super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           super_GeneratedMakeCommand).PrimaryCommand.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          if ((element_type *)local_d8._0_8_ != (element_type *)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          iVar9 = 1;
          goto LAB_00390325;
        }
        std::__cxx11::string::_M_append((char *)output,(ulong)outputBuffer._M_dataplus._M_p);
        rng = rng + 4;
      } while (((pointer)rng !=
                makeCommand.
                super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish) && (retVal == 0));
    }
    std::__cxx11::string::append((char *)output);
    cmSystemTools::s_RunCommandHideConsole = bVar5;
    bVar5 = cmState::UseWatcomWMake
                      ((this->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    iVar9 = retVal;
    if ((bVar5 && retVal == 0) &&
       (lVar6 = std::__cxx11::string::find((char *)output,0x6bb081,0), iVar9 = retVal, lVar6 != -1))
    {
      retVal = 1;
      iVar9 = retVal;
    }
LAB_00390325:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)makeCommandStr._M_dataplus._M_p != &makeCommandStr.field_2) {
      operator_delete(makeCommandStr._M_dataplus._M_p,
                      CONCAT71(makeCommandStr.field_2._M_allocated_capacity._1_7_,
                               makeCommandStr.field_2._M_local_buf[0]) + 1);
    }
  }
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::~vector(&makeCommand);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputBuffer._M_dataplus._M_p != &outputBuffer.field_2) {
    operator_delete(outputBuffer._M_dataplus._M_p,
                    CONCAT71(outputBuffer.field_2._M_allocated_capacity._1_7_,
                             outputBuffer.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)realConfig._M_dataplus._M_p != &realConfig.field_2) {
    operator_delete(realConfig._M_dataplus._M_p,realConfig.field_2._M_allocated_capacity + 1);
  }
LAB_0039038a:
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return iVar9;
}

Assistant:

int cmGlobalGenerator::Build(
  int jobs, const std::string& /*unused*/, const std::string& bindir,
  const std::string& projectName, const std::vector<std::string>& targets,
  std::string& output, const std::string& makeCommandCSTR,
  const std::string& config, const cmBuildOptions& buildOptions, bool verbose,
  cmDuration timeout, cmSystemTools::OutputOption outputflag,
  std::vector<std::string> const& nativeOptions)
{
  bool hideconsole = cmSystemTools::GetRunCommandHideConsole();

  /**
   * Run an executable command and put the stdout in output.
   */
  cmWorkingDirectory workdir(bindir);
  output += "Change Dir: ";
  output += bindir;
  output += "\n";
  if (workdir.Failed()) {
    cmSystemTools::SetRunCommandHideConsole(hideconsole);
    std::string err = cmStrCat("Failed to change directory: ",
                               std::strerror(workdir.GetLastResult()));
    cmSystemTools::Error(err);
    output += err;
    output += "\n";
    return 1;
  }
  std::string realConfig = config;
  if (realConfig.empty()) {
    realConfig = this->GetDefaultBuildConfig();
  }

  int retVal = 0;
  cmSystemTools::SetRunCommandHideConsole(true);
  std::string outputBuffer;
  std::string* outputPtr = &outputBuffer;

  std::vector<GeneratedMakeCommand> makeCommand = this->GenerateBuildCommand(
    makeCommandCSTR, projectName, bindir, targets, realConfig, jobs, verbose,
    buildOptions, nativeOptions);

  // Workaround to convince some commands to produce output.
  if (outputflag == cmSystemTools::OUTPUT_PASSTHROUGH &&
      makeCommand.back().RequiresOutputForward) {
    outputflag = cmSystemTools::OUTPUT_FORWARD;
  }

  // should we do a clean first?
  if (buildOptions.Clean) {
    std::vector<GeneratedMakeCommand> cleanCommand =
      this->GenerateBuildCommand(makeCommandCSTR, projectName, bindir,
                                 { "clean" }, realConfig, jobs, verbose,
                                 buildOptions);
    output += "\nRun Clean Command:";
    output += cleanCommand.front().Printable();
    output += "\n";
    if (cleanCommand.size() != 1) {
      this->GetCMakeInstance()->IssueMessage(MessageType::INTERNAL_ERROR,
                                             "The generator did not produce "
                                             "exactly one command for the "
                                             "'clean' target");
      return 1;
    }
    if (!cmSystemTools::RunSingleCommand(cleanCommand.front().PrimaryCommand,
                                         outputPtr, outputPtr, &retVal,
                                         nullptr, outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error("Generator: execution of make clean failed.");
      output += *outputPtr;
      output += "\nGenerator: execution of make clean failed.\n";

      return 1;
    }
    output += *outputPtr;
  }

  // now build
  std::string makeCommandStr;
  output += "\nRun Build Command(s):";

  retVal = 0;
  for (auto command = makeCommand.begin();
       command != makeCommand.end() && retVal == 0; ++command) {
    makeCommandStr = command->Printable();
    if (command != makeCommand.end()) {
      makeCommandStr += " && ";
    }

    output += makeCommandStr;
    if (!cmSystemTools::RunSingleCommand(command->PrimaryCommand, outputPtr,
                                         outputPtr, &retVal, nullptr,
                                         outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error(
        "Generator: execution of make failed. Make command was: " +
        makeCommandStr);
      output += *outputPtr;
      output += "\nGenerator: execution of make failed. Make command was: " +
        makeCommandStr + "\n";

      return 1;
    }
    output += *outputPtr;
  }
  output += "\n";
  cmSystemTools::SetRunCommandHideConsole(hideconsole);

  // The OpenWatcom tools do not return an error code when a link
  // library is not found!
  if (this->CMakeInstance->GetState()->UseWatcomWMake() && retVal == 0 &&
      output.find("W1008: cannot open") != std::string::npos) {
    retVal = 1;
  }

  return retVal;
}